

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O0

void __thiscall
test_vector_dense_scalar_multiplication_Test::TestBody
          (test_vector_dense_scalar_multiplication_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  reference pvVar4;
  initializer_list<double> *list;
  Vector_Dense<double,_2UL> VVar5;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_4;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  undefined8 local_150;
  double local_148;
  double dStack_140;
  double local_138 [2];
  initializer_list<double> local_128;
  undefined1 auStack_118 [8];
  Vector_Dense<double,_2UL> static_vector;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_2;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  Vector_Dense<double,_0UL> local_90;
  double local_78;
  Vector_Dense<double,_0UL> local_70;
  double local_58 [4];
  initializer_list<double> local_38;
  undefined1 local_28 [8];
  Vector_Dense<double,_0UL> dynamic_vector;
  test_vector_dense_scalar_multiplication_Test *this_local;
  
  local_58[2] = 3.0;
  local_58[0] = 1.0;
  local_58[1] = 2.0;
  local_38._M_array = local_58;
  local_38._M_len = 3;
  dynamic_vector.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense((Vector_Dense<double,_0UL> *)local_28,&local_38);
  local_78 = -3.0;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense(&local_90,(Vector_Dense<double,_0UL> *)local_28);
  Disa::operator*(&local_70,&local_78,&local_90);
  Disa::Vector_Dense<double,_0UL>::operator=((Vector_Dense<double,_0UL> *)local_28,&local_70);
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense(&local_70);
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense(&local_90);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_b0,"dynamic_vector[0]","-3.0",*pvVar2,-3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_d0,"dynamic_vector[1]","-6.0",*pvVar2,-6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_28,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_f0,"dynamic_vector[2]","-9.0",*pvVar2,-9.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_138[0] = 3.0;
  local_138[1] = -5.0;
  local_128._M_array = local_138;
  local_128._M_len = 2;
  list = &local_128;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense((Vector_Dense<double,_2UL> *)auStack_118,list);
  local_150 = 0x4010000000000000;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_118;
  VVar5.super_array<double,_2UL>._M_elems[1] = static_vector.super_array<double,_2UL>._M_elems[0];
  VVar5.super_array<double,_2UL>._M_elems[0] = (double)auStack_118;
  VVar5 = Disa::operator*((Disa *)&local_150,(double *)list,VVar5);
  dStack_140 = VVar5.super_array<double,_2UL>._M_elems[1];
  local_148 = VVar5.super_array<double,_2UL>._M_elems[0];
  auStack_118 = (undefined1  [8])local_148;
  static_vector.super_array<double,_2UL>._M_elems[0] = dStack_140;
  pvVar4 = std::array<double,_2UL>::operator[]((array<double,_2UL> *)auStack_118,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_178,"static_vector[0]","12.0",*pvVar4,12.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  pvVar4 = std::array<double,_2UL>::operator[]((array<double,_2UL> *)auStack_118,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_198,"static_vector[1]","-20.0",*pvVar4,-20.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xa4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  Disa::Vector_Dense<double,_0UL>::~Vector_Dense((Vector_Dense<double,_0UL> *)local_28);
  return;
}

Assistant:

TEST(test_vector_dense, scalar_multiplication) {
  Vector_Dense<Scalar, 0> dynamic_vector = {1.0, 2.0, 3.0};
  dynamic_vector = -3.0 * dynamic_vector;
  EXPECT_DOUBLE_EQ(dynamic_vector[0], -3.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], -6.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], -9.0);

  Vector_Dense<Scalar, 2> static_vector = {3.0, -5.0};
  static_vector = 4.0 * static_vector;
  EXPECT_DOUBLE_EQ(static_vector[0], 12.0);
  EXPECT_DOUBLE_EQ(static_vector[1], -20.0);
}